

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O2

void DrawLogoTexture(void)

{
  long lVar1;
  undefined8 uVar2;
  SDL_Surface *surface;
  GLfloat texcoord [4];
  
  lVar1 = SDL_GetVideoSurface();
  if (global_texture == 0) {
    uVar2 = SDL_RWFromFile("icon.bmp","rb");
    surface = (SDL_Surface *)SDL_LoadBMP_RW(uVar2,1);
    if (surface == (SDL_Surface *)0x0) {
      return;
    }
    DrawLogoTexture::w = surface->w;
    DrawLogoTexture::h = surface->h;
    global_texture = SDL_GL_LoadTexture(surface,texcoord);
    DrawLogoTexture::texMinX = texcoord[0];
    DrawLogoTexture::texMinY = texcoord[1];
    DrawLogoTexture::texMaxX = texcoord[2];
    DrawLogoTexture::texMaxY = texcoord[3];
    SDL_FreeSurface(surface);
    if (global_texture == 0) {
      return;
    }
  }
  DrawLogoTexture::x = DrawLogoTexture::x + DrawLogoTexture::delta_x;
  if (DrawLogoTexture::x < 0) {
    DrawLogoTexture::x = 0;
LAB_00102c1f:
    DrawLogoTexture::delta_x = -DrawLogoTexture::delta_x;
  }
  else if (*(int *)(lVar1 + 0x10) < DrawLogoTexture::x + DrawLogoTexture::w) {
    DrawLogoTexture::x = *(int *)(lVar1 + 0x10) - DrawLogoTexture::w;
    goto LAB_00102c1f;
  }
  DrawLogoTexture::y = DrawLogoTexture::y + DrawLogoTexture::delta_y;
  if (DrawLogoTexture::y < 0) {
    DrawLogoTexture::y = 0;
  }
  else {
    if (DrawLogoTexture::y + DrawLogoTexture::h <= *(int *)(lVar1 + 0x14)) goto LAB_00102c66;
    DrawLogoTexture::y = *(int *)(lVar1 + 0x14) - DrawLogoTexture::h;
  }
  DrawLogoTexture::delta_y = -DrawLogoTexture::delta_y;
LAB_00102c66:
  SDL_GL_Enter2DMode();
  glBindTexture(0xde1,global_texture);
  glBegin(5);
  glTexCoord2f(DrawLogoTexture::texMinX,DrawLogoTexture::texMinY);
  glVertex2i(DrawLogoTexture::x,DrawLogoTexture::y);
  glTexCoord2f(DrawLogoTexture::texMaxX,DrawLogoTexture::texMinY);
  glVertex2i(DrawLogoTexture::w + DrawLogoTexture::x,DrawLogoTexture::y);
  glTexCoord2f(DrawLogoTexture::texMinX,DrawLogoTexture::texMaxY);
  glVertex2i(DrawLogoTexture::x,DrawLogoTexture::h + DrawLogoTexture::y);
  glTexCoord2f(DrawLogoTexture::texMaxX,DrawLogoTexture::texMaxY);
  glVertex2i(DrawLogoTexture::w + DrawLogoTexture::x,DrawLogoTexture::h + DrawLogoTexture::y);
  glEnd();
  SDL_GL_Leave2DMode();
  return;
}

Assistant:

void DrawLogoTexture(void)
{
	static GLfloat texMinX, texMinY;
	static GLfloat texMaxX, texMaxY;
	static int x = 0;
	static int y = 0;
	static int w, h;
	static int delta_x = 1;
	static int delta_y = 1;

	SDL_Surface *screen = SDL_GetVideoSurface();

	if ( ! global_texture ) {
		SDL_Surface *image;
		GLfloat texcoord[4];

		/* Load the image (could use SDL_image library here) */
		image = SDL_LoadBMP(LOGO_FILE);
		if ( image == NULL ) {
			return;
		}
		w = image->w;
		h = image->h;

		/* Convert the image into an OpenGL texture */
		global_texture = SDL_GL_LoadTexture(image, texcoord);

		/* Make texture coordinates easy to understand */
		texMinX = texcoord[0];
		texMinY = texcoord[1];
		texMaxX = texcoord[2];
		texMaxY = texcoord[3];

		/* We don't need the original image anymore */
		SDL_FreeSurface(image);

		/* Make sure that the texture conversion is okay */
		if ( ! global_texture ) {
			return;
		}
	}

	/* Move the image around */
	x += delta_x;
	if ( x < 0 ) {
		x = 0;
		delta_x = -delta_x;
	} else
	if ( (x+w) > screen->w ) {
		x = screen->w-w;
		delta_x = -delta_x;
	}
	y += delta_y;
	if ( y < 0 ) {
		y = 0;
		delta_y = -delta_y;
	} else
	if ( (y+h) > screen->h ) {
		y = screen->h-h;
		delta_y = -delta_y;
	}

	/* Show the image on the screen */
	SDL_GL_Enter2DMode();
	glBindTexture(GL_TEXTURE_2D, global_texture);
	glBegin(GL_TRIANGLE_STRIP);
	glTexCoord2f(texMinX, texMinY); glVertex2i(x,   y  );
	glTexCoord2f(texMaxX, texMinY); glVertex2i(x+w, y  );
	glTexCoord2f(texMinX, texMaxY); glVertex2i(x,   y+h);
	glTexCoord2f(texMaxX, texMaxY); glVertex2i(x+w, y+h);
	glEnd();
	SDL_GL_Leave2DMode();
}